

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Promise<kj::String> __thiscall
kj::AsyncInputStream::readAllText(AsyncInputStream *this,uint64_t limit)

{
  AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::AllReader>_> *pAVar1;
  TransformPromiseNodeBase *this_00;
  Disposer *in_RDX;
  PromiseNode *extraout_RDX;
  AllReader *ptrCopy;
  Promise<kj::String> PVar2;
  undefined1 local_70 [16];
  Own<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::AllReader>_>_> local_60;
  Promise<kj::String> promise;
  Own<kj::(anonymous_namespace)::AllReader> reader;
  Own<kj::_::PromiseNode> local_30;
  
  heap<kj::(anonymous_namespace)::AllReader,kj::AsyncInputStream&>
            ((kj *)&reader,(AsyncInputStream *)limit);
  anon_unknown_77::AllReader::loop((AllReader *)local_70,(uint64_t)reader.ptr);
  this_00 = (TransformPromiseNodeBase *)operator_new(0x38);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,(Own<kj::_::PromiseNode> *)local_70,
             _::
             TransformPromiseNode<kj::String,_unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:134:29),_kj::_::PropagateException>
             ::anon_class_16_2_f81c8ca8_for_func::operator());
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0042fc70;
  this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)reader.ptr;
  this_00[1].dependency.disposer = in_RDX;
  local_30.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::String,unsigned_long,kj::(anonymous_namespace)::AllReader::readAllText(unsigned_long)::{lambda(unsigned_long)#1},kj::_::PropagateException>>
        ::instance;
  local_60.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::String,unsigned_long,kj::(anonymous_namespace)::AllReader::readAllText(unsigned_long)::{lambda(unsigned_long)#1},kj::_::PropagateException>>
        ::instance;
  local_30.ptr = (PromiseNode *)0x0;
  promise.super_PromiseBase.node.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::String,unsigned_long,kj::(anonymous_namespace)::AllReader::readAllText(unsigned_long)::{lambda(unsigned_long)#1},kj::_::PropagateException>>
        ::instance;
  local_60.ptr = (AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::AllReader>_> *)0x0;
  promise.super_PromiseBase.node.ptr = (PromiseNode *)this_00;
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)(local_70 + 0x10));
  Own<kj::_::PromiseNode>::dispose(&local_30);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_70);
  local_70._0_8_ = reader.disposer;
  local_70._8_8_ = reader.ptr;
  reader.ptr = (AllReader *)0x0;
  heap<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::AllReader>>,kj::Own<kj::_::PromiseNode>,kj::Own<kj::(anonymous_namespace)::AllReader>>
            ((kj *)(local_70 + 0x10),(Own<kj::_::PromiseNode> *)&promise,
             (Own<kj::(anonymous_namespace)::AllReader> *)local_70);
  pAVar1 = local_60.ptr;
  local_30.disposer = local_60.disposer;
  local_60.ptr = (AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::AllReader>_> *)0x0;
  this->_vptr_AsyncInputStream = (_func_int **)local_60.disposer;
  this[1]._vptr_AsyncInputStream = (_func_int **)pAVar1;
  local_30.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode>::dispose(&local_30);
  Own<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::AllReader>_>_>::~Own
            ((Own<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::AllReader>_>_> *)
             (local_70 + 0x10));
  if ((AllReader *)local_70._8_8_ != (AllReader *)0x0) {
    (***(_func_int ***)local_70._0_8_)();
  }
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&promise);
  PVar2.super_PromiseBase.node.ptr = extraout_RDX;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::String>)PVar2.super_PromiseBase.node;
}

Assistant:

Promise<String> AsyncInputStream::readAllText(uint64_t limit) {
  auto reader = kj::heap<AllReader>(*this);
  auto promise = reader->readAllText(limit);
  return promise.attach(kj::mv(reader));
}